

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildBrLocalProperty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId_00;
  uint uVar4;
  RegSlot reg;
  undefined4 *puVar5;
  OpLayoutBrLocalProperty *pOVar6;
  StackSym *pSVar7;
  ByteCodeUsesInstr *this_00;
  JITTimeFunctionBody *pJVar8;
  SymOpnd *srcOpnd;
  BranchInstr *branchInstr_00;
  SymOpnd *fieldSymOpnd;
  uint targetOffset;
  PropertyId propertyId;
  BranchInstr *branchInstr;
  ByteCodeUsesInstr *byteCodeUse;
  OpLayoutBrLocalProperty *branchInsn;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d0c,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (newOpcode != BrOnHasLocalProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d0d,"(newOpcode == Js::OpCode::BrOnHasLocalProperty)",
                       "newOpcode == Js::OpCode::BrOnHasLocalProperty");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = Js::ByteCodeReader::BrLocalProperty(&this->m_jnReader);
  pSVar7 = Func::GetLocalClosureSym(this->m_func);
  bVar3 = StackSym::HasByteCodeRegSlot(pSVar7);
  if (bVar3) {
    this_00 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
    pSVar7 = Func::GetLocalClosureSym(this->m_func);
    IR::ByteCodeUsesInstr::SetNonOpndSymbol(this_00,(pSVar7->super_Sym).m_id);
    AddInstr(this,&this_00->super_Instr,offset);
  }
  pJVar8 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetReferencedPropertyId(pJVar8,pOVar6->PropertyIdIndex);
  uVar4 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  sVar1 = pOVar6->RelativeJumpOffset;
  pJVar8 = Func::GetJITFunctionBody(this->m_func);
  reg = JITTimeFunctionBody::GetLocalClosureReg(pJVar8);
  srcOpnd = BuildFieldOpnd(this,newOpcode,reg,propertyId_00,pOVar6->PropertyIdIndex,PropertyKindData
                           ,0xffffffff);
  branchInstr_00 =
       IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,&srcOpnd->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr_00,offset,uVar4 + (int)sVar1);
  return;
}

Assistant:

void
IRBuilder::BuildBrLocalProperty(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));
    Assert(newOpcode == Js::OpCode::BrOnHasLocalProperty);

    const unaligned   Js::OpLayoutBrLocalProperty *branchInsn = m_jnReader.BrLocalProperty();

    if (m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
    {
        IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
        byteCodeUse->SetNonOpndSymbol(m_func->GetLocalClosureSym()->m_id);
        this->AddInstr(byteCodeUse, offset);
    }

    IR::BranchInstr * branchInstr;
    Js::PropertyId    propertyId =
        m_func->GetJITFunctionBody()->GetReferencedPropertyId(branchInsn->PropertyIdIndex);
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
    IR::SymOpnd *     fieldSymOpnd = this->BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, branchInsn->PropertyIdIndex, PropertyKindData);

    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, fieldSymOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}